

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

Status __thiscall soplex::SPxBasisBase<double>::dualColStatus(SPxBasisBase<double> *this,int i)

{
  double *pdVar1;
  int in_stack_ffffffffffffffbc;
  SPxLPBase<double> *in_stack_ffffffffffffffc0;
  double dVar2;
  undefined4 local_4;
  
  pdVar1 = SPxLPBase<double>::upper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  dVar2 = *pdVar1;
  pdVar1 = (double *)infinity();
  if (*pdVar1 <= dVar2) {
    pdVar1 = SPxLPBase<double>::lower(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    dVar2 = *pdVar1;
    pdVar1 = (double *)infinity();
    if (dVar2 <= -*pdVar1) {
      local_4 = D_UNDEFINED;
    }
    else {
      local_4 = D_ON_UPPER;
    }
  }
  else {
    pdVar1 = SPxLPBase<double>::lower(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    dVar2 = *pdVar1;
    pdVar1 = (double *)infinity();
    if (dVar2 <= -*pdVar1) {
      local_4 = D_ON_LOWER;
    }
    else {
      pdVar1 = SPxLPBase<double>::lower(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      dVar2 = *pdVar1;
      pdVar1 = SPxLPBase<double>::upper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        local_4 = D_ON_BOTH;
      }
      else {
        local_4 = D_FREE;
      }
    }
  }
  return local_4;
}

Assistant:

typename SPxBasisBase<R>::Desc::Status
SPxBasisBase<R>::dualColStatus(int i) const
{
   assert(theLP != nullptr);

   if(theLP->SPxLPBase<R>::upper(i) < R(infinity))
   {
      if(theLP->SPxLPBase<R>::lower(i) > R(-infinity))
      {
         if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
            return Desc::D_FREE;
         else
            return Desc::D_ON_BOTH;
      }
      else
         return Desc::D_ON_LOWER;
   }
   else if(theLP->SPxLPBase<R>::lower(i) > R(-infinity))
      return Desc::D_ON_UPPER;
   else
      return Desc::D_UNDEFINED;
}